

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_unpack.cpp
# Opt level: O0

int Unpack_UnnamedMarkers(char **pptr,sFrameOfData *Frame)

{
  int iVar1;
  int iVar2;
  int *__src;
  void *pvVar3;
  long in_RSI;
  long *in_RDI;
  int nMarkers;
  int nTotalBytes;
  int nBytes;
  char *ptr;
  
  iVar1 = *(int *)*in_RDI;
  __src = (int *)*in_RDI + 1;
  iVar2 = iVar1 * 0xc;
  if (iVar1 != *(int *)(in_RSI + 0x4b10)) {
    *(int *)(in_RSI + 0x4b10) = iVar1;
    pvVar3 = realloc(*(void **)(in_RSI + 0x4b18),(long)iVar2);
    *(void **)(in_RSI + 0x4b18) = pvVar3;
  }
  memcpy(*(void **)(in_RSI + 0x4b18),__src,(long)iVar2);
  *in_RDI = (long)__src + (long)iVar2;
  return iVar2 + 4;
}

Assistant:

int Unpack_UnnamedMarkers(char **pptr, sFrameOfData *Frame)
{
  char *ptr = *pptr;
  int nBytes = 0;
  int nTotalBytes = 0;
  int nMarkers;

  memcpy(&nMarkers, ptr, 4);
  ptr += 4;
  nTotalBytes += 4;

  nBytes = nMarkers * sizeof(tMarkerData);

  if (nMarkers != Frame->nUnidentifiedMarkers) {
    Frame->nUnidentifiedMarkers = nMarkers;
    Frame->UnidentifiedMarkers
        = (tMarkerData*) realloc(Frame->UnidentifiedMarkers, nBytes);
  }

  memcpy(Frame->UnidentifiedMarkers, ptr, nBytes);
  ptr += nBytes;
  nTotalBytes += nBytes;

  *pptr = ptr;
  return nTotalBytes;
}